

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# GTIN.cpp
# Opt level: O0

string * ZXing::GTIN::IssueNr(string *ean2AddOn)

{
  long lVar1;
  string *in_RDI;
  int in_stack_0000002c;
  size_t *in_stack_ffffffffffffffd8;
  string *__str;
  
  __str = in_RDI;
  lVar1 = std::__cxx11::string::size();
  if (lVar1 == 2) {
    std::__cxx11::stoi(__str,in_stack_ffffffffffffffd8,0);
    std::__cxx11::to_string(in_stack_0000002c);
  }
  else {
    std::__cxx11::string::string((string *)__str);
  }
  return in_RDI;
}

Assistant:

std::string IssueNr(const std::string& ean2AddOn)
{
	if (ean2AddOn.size() != 2)
		return {};

	return std::to_string(std::stoi(ean2AddOn));
}